

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_array_equal_u32string(void)

{
  size_type sVar1;
  basic_variable<std::allocator<char>_> *pbVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  basic_variable<std::allocator<char>_> *local_6a0;
  basic_variable<std::allocator<char>_> *local_688;
  basic_variable<std::allocator<char>_> *local_670;
  basic_variable<std::allocator<char>_> *local_658;
  undefined1 local_649;
  basic_variable<std::allocator<char>_> local_648;
  basic_variable<std::allocator<char>_> *local_610;
  basic_variable<std::allocator<char>_> local_608;
  basic_variable<std::allocator<char>_> local_5d8;
  basic_variable<std::allocator<char>_> local_5a8;
  undefined1 local_578 [77];
  undefined1 local_52b [2];
  undefined1 local_529;
  basic_variable<std::allocator<char>_> local_528;
  basic_variable<std::allocator<char>_> *local_4f0;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> local_4b8;
  basic_variable<std::allocator<char>_> local_488;
  undefined1 local_458 [77];
  undefined1 local_40b [2];
  undefined1 local_409;
  basic_variable<std::allocator<char>_> local_408;
  basic_variable<std::allocator<char>_> *local_3d0;
  basic_variable<std::allocator<char>_> local_3c8;
  basic_variable<std::allocator<char>_> local_398;
  basic_variable<std::allocator<char>_> local_368;
  undefined1 local_338 [77];
  undefined1 local_2eb [2];
  undefined1 local_2e9;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> *local_2b0;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  basic_variable<std::allocator<char>_> local_248;
  undefined1 local_218 [77];
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_78,L"");
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(U\"\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd58,"void equality_suite::compare_array_equal_u32string()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_e8,L"");
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(U\"\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd59,"void equality_suite::compare_array_equal_u32string()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_158,L"delta");
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() == variable(U\"delta\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd5a,"void equality_suite::compare_array_equal_u32string()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_array<std::allocator<char>_>::make();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1c8,L"delta");
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  sVar1 = 0xd5b;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make() != variable(U\"delta\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd5b,"void equality_suite::compare_array_equal_u32string()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  local_2b0 = &local_2a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,1);
  local_2b0 = &local_278;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,2);
  local_2b0 = &local_248;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_2b0,3);
  local_218._0_8_ = &local_2a8;
  local_218._8_8_ = 3;
  init._M_len = sVar1;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),
             (basic_array<std::allocator<char>_> *)local_218._0_8_,init);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"");
  local_1cb[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10),&local_2e8);
  local_2e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(U\"\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd5d,"void equality_suite::compare_array_equal_u32string()",local_1cb,&local_2e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_218 + 0x10));
  pbVar2 = &local_2a8;
  local_658 = (basic_variable<std::allocator<char>_> *)local_218;
  do {
    local_658 = local_658 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_658);
  } while (local_658 != pbVar2);
  local_3d0 = &local_3c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,1);
  local_3d0 = &local_398;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,2);
  local_3d0 = &local_368;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_3d0,3);
  local_338._0_8_ = &local_3c8;
  local_338._8_8_ = 3;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10),
             (basic_array<std::allocator<char>_> *)local_338._0_8_,init_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_408,L"");
  local_2eb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10),&local_408);
  local_409 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(U\"\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd5e,"void equality_suite::compare_array_equal_u32string()",local_2eb,&local_409);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_338 + 0x10));
  pbVar2 = &local_3c8;
  local_670 = (basic_variable<std::allocator<char>_> *)local_338;
  do {
    local_670 = local_670 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_670);
  } while (local_670 != pbVar2);
  local_4f0 = &local_4e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,1);
  local_4f0 = &local_4b8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,2);
  local_4f0 = &local_488;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_4f0,3);
  local_458._0_8_ = &local_4e8;
  local_458._8_8_ = 3;
  init_01._M_len = (size_type)pbVar2;
  init_01._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10),
             (basic_array<std::allocator<char>_> *)local_458._0_8_,init_01);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_528,L"delta");
  local_40b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10),&local_528);
  local_529 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) == variable(U\"delta\")","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd5f,"void equality_suite::compare_array_equal_u32string()",local_40b,&local_529);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_528);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_458 + 0x10));
  pbVar2 = &local_4e8;
  local_688 = (basic_variable<std::allocator<char>_> *)local_458;
  do {
    local_688 = local_688 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_688);
  } while (local_688 != pbVar2);
  local_610 = &local_608;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,1);
  local_610 = &local_5d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,2);
  local_610 = &local_5a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_610,3);
  local_578._0_8_ = &local_608;
  local_578._8_8_ = 3;
  init_02._M_len = (size_type)pbVar2;
  init_02._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10),
             (basic_array<std::allocator<char>_> *)local_578._0_8_,init_02);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_648,L"delta");
  local_52b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10),&local_648);
  local_649 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("array::make({ 1, 2, 3 }) != variable(U\"delta\")","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0xd60,"void equality_suite::compare_array_equal_u32string()",local_52b,&local_649);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_578 + 0x10));
  local_6a0 = (basic_variable<std::allocator<char>_> *)local_578;
  do {
    local_6a0 = local_6a0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_6a0);
  } while (local_6a0 != &local_608);
  return;
}

Assistant:

void compare_array_equal_u32string()
{
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(U""), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(U""), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() == variable(U"delta"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make() != variable(U"delta"), true);

    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(U""), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(U""), true);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) == variable(U"delta"), false);
    TRIAL_PROTOCOL_TEST_EQUAL(array::make({ 1, 2, 3 }) != variable(U"delta"), true);
}